

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O3

HighsStatus __thiscall
Highs::getRows(Highs *this,HighsInt num_set_entries,HighsInt *set,HighsInt *num_row,double *lower,
              double *upper,HighsInt *num_nz,HighsInt *start,HighsInt *index,double *value)

{
  function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_HighsCallbackDataOut_*,_HighsCallbackDataIn_*,_void_*)>
  *this_00;
  string method;
  HighsInt HVar1;
  HighsStatus HVar2;
  undefined8 uVar3;
  undefined8 in_stack_fffffffffffffee8;
  undefined1 *local_108 [2];
  undefined1 local_f8 [16];
  HighsLogOptions local_e8;
  HighsIndexCollection index_collection;
  
  if (num_set_entries == 0) {
    HVar2 = kOk;
    *num_row = 0;
    *num_nz = 0;
  }
  else {
    index_collection.dimension_ = -1;
    index_collection.is_interval_ = false;
    index_collection.from_ = -1;
    index_collection.to_ = -2;
    index_collection.is_set_ = false;
    index_collection.set_num_entries_ = -1;
    index_collection.mask_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    index_collection.mask_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    index_collection.mask_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    index_collection.set_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    index_collection.set_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish._0_1_ = 0;
    index_collection.set_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish._1_7_ = 0;
    index_collection.set_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
    index_collection._41_8_ = 0;
    HVar1 = create(&index_collection,num_set_entries,set,(this->model_).lp_.num_row_);
    if (HVar1 == 0) {
      HVar2 = kOk;
      getRowsInterface(this,&index_collection,num_row,lower,upper,num_nz,start,index,value);
    }
    else {
      local_e8.log_stream = (this->options_).super_HighsOptionsStruct.log_options.log_stream;
      local_e8.output_flag = (this->options_).super_HighsOptionsStruct.log_options.output_flag;
      local_e8.log_to_console = (this->options_).super_HighsOptionsStruct.log_options.log_to_console
      ;
      local_e8.log_dev_level = (this->options_).super_HighsOptionsStruct.log_options.log_dev_level;
      local_e8.user_log_callback =
           (this->options_).super_HighsOptionsStruct.log_options.user_log_callback;
      local_e8.user_log_callback_data =
           (this->options_).super_HighsOptionsStruct.log_options.user_log_callback_data;
      this_00 = &local_e8.user_callback;
      std::
      function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_HighsCallbackDataOut_*,_HighsCallbackDataIn_*,_void_*)>
      ::function(this_00,&(this->options_).super_HighsOptionsStruct.log_options.user_callback);
      local_e8.user_callback_active =
           (this->options_).super_HighsOptionsStruct.log_options.user_callback_active;
      local_e8.user_callback_data =
           (this->options_).super_HighsOptionsStruct.log_options.user_callback_data;
      uVar3 = 0x210f61;
      local_108[0] = local_f8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"getRows","");
      method._M_string_length = uVar3;
      method._M_dataplus._M_p = (pointer)(ulong)(uint)(this->model_).lp_.num_row_;
      method.field_2._M_allocated_capacity = in_stack_fffffffffffffee8;
      method.field_2._8_8_ = upper;
      analyseSetCreateError
                (&local_e8,method,(HighsInt)local_108[0],SUB41(HVar1,0),0,
                 (HighsInt *)(ulong)(uint)num_set_entries,(HighsInt)set);
      if (local_108[0] != local_f8) {
        operator_delete(local_108[0]);
      }
      HVar2 = kError;
      if (local_e8.user_callback.super__Function_base._M_manager != (_Manager_type)0x0) {
        (*local_e8.user_callback.super__Function_base._M_manager)
                  ((_Any_data *)this_00,(_Any_data *)this_00,__destroy_functor);
      }
    }
    if (index_collection.mask_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(index_collection.mask_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (index_collection.set_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(index_collection.set_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  return HVar2;
}

Assistant:

HighsStatus Highs::getRows(const HighsInt num_set_entries, const HighsInt* set,
                           HighsInt& num_row, double* lower, double* upper,
                           HighsInt& num_nz, HighsInt* start, HighsInt* index,
                           double* value) const {
  if (num_set_entries == 0) {
    num_row = 0;
    num_nz = 0;
    return HighsStatus::kOk;
  }
  HighsIndexCollection index_collection;
  const HighsInt create_error =
      create(index_collection, num_set_entries, set, model_.lp_.num_row_);
  if (create_error)
    return analyseSetCreateError(options_.log_options, "getRows", create_error,
                                 false, num_set_entries, set,
                                 model_.lp_.num_row_);
  getRowsInterface(index_collection, num_row, lower, upper, num_nz, start,
                   index, value);
  return HighsStatus::kOk;
}